

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

int lws_role_call_alpn_negotiated(lws *wsi,char *alpn)

{
  lws_role_ops *plVar1;
  int iVar2;
  lws_log_cx *cx;
  lws_role_ops **pplVar3;
  
  if (alpn != (char *)0x0) {
    cx = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_role_call_alpn_negotiated","\'%s\'",alpn);
    pplVar3 = available_roles;
    while (plVar1 = *pplVar3, plVar1 != (lws_role_ops *)0x0) {
      pplVar3 = pplVar3 + 1;
      if (plVar1->alpn != (char *)0x0) {
        iVar2 = strcmp(plVar1->alpn,alpn);
        if (iVar2 == 0) {
          if (0xf < plVar1->rops_idx[6]) {
            iVar2 = (*plVar1->rops_table[(plVar1->rops_idx[6] >> 4) - 1].check_upgrades)(wsi);
            return iVar2;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int
lws_role_call_alpn_negotiated(struct lws *wsi, const char *alpn)
{
#if defined(LWS_WITH_TLS)
	if (!alpn)
		return 0;

#if !defined(LWS_ESP_PLATFORM)
	lwsl_wsi_info(wsi, "'%s'", alpn);
#endif

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->alpn && !strcmp(ar->alpn, alpn) &&
		    lws_rops_fidx(ar, LWS_ROPS_alpn_negotiated)) {
#if defined(LWS_WITH_SERVER)
			lws_metrics_tag_wsi_add(wsi, "upg", ar->name);
#endif
			return (lws_rops_func_fidx(ar, LWS_ROPS_alpn_negotiated)).
						   alpn_negotiated(wsi, alpn);
		}
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;
#endif
	return 0;
}